

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeEmitter.cpp
# Opt level: O0

void __thiscall
ByteCodeGenerator::EmitPropDelete
          (ByteCodeGenerator *this,RegSlot lhsLocation,Symbol *sym,IdentPtr pid,FuncInfo *funcInfo)

{
  code *pcVar1;
  FuncInfo *pFVar2;
  bool bVar3;
  ScopeType SVar4;
  uint32 uVar5;
  DynamicLoadKind DVar6;
  ByteCodeLabel labelID;
  uint uVar7;
  RegSlot RVar8;
  int iVar9;
  undefined4 *puVar10;
  FuncInfo *pFVar11;
  Type *pTVar12;
  PropertyId local_160;
  PropertyId local_12c;
  PropertyId local_f8;
  Scope *local_c8;
  PropertyIdIndexType propertyIndex_1;
  PropertyId propertyId_2;
  RegSlot instLocation;
  int i;
  ByteCodeLabel doneLabel;
  PropertyId propertyId_1;
  uint32 frameDisplayIndex_1;
  uint32 frameDisplayIndex;
  PropertyIdIndexType propertyIndex;
  PropertyId propertyId;
  DynamicLoadRecord rec;
  undefined1 local_78 [8];
  List<DynamicLoadRecord,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
  recList;
  Scope *symScope;
  Scope *scope;
  PropertyId envIndex;
  RegSlot scopeLocation;
  FuncInfo *funcInfo_local;
  IdentPtr pid_local;
  Symbol *sym_local;
  ByteCodeGenerator *pBStack_10;
  RegSlot lhsLocation_local;
  ByteCodeGenerator *this_local;
  
  scope._4_4_ = ~Invalid;
  scope._0_4_ = -1;
  symScope = (Scope *)0x0;
  _envIndex = funcInfo;
  funcInfo_local = (FuncInfo *)pid;
  pid_local = (IdentPtr)sym;
  sym_local._4_4_ = lhsLocation;
  pBStack_10 = this;
  if (sym == (Symbol *)0x0) {
    local_c8 = this->globalScope;
  }
  else {
    local_c8 = Symbol::GetScope(sym);
  }
  recList._40_8_ = local_c8;
  if (local_c8 == (Scope *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar10 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar10 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeEmitter.cpp"
                       ,0x14d1,"(symScope)","symScope");
    if (!bVar3) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar10 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar10 = 0;
  }
  JsUtil::
  List<DynamicLoadRecord,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>::
  List((List<DynamicLoadRecord,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
        *)local_78,this->alloc,4);
  while( true ) {
    symScope = FindScopeForSym(this,(Scope *)recList._40_8_,symScope,(PropertyId *)&scope,_envIndex)
    ;
    pFVar2 = _envIndex;
    if (symScope == this->globalScope) {
      scope._4_4_ = ~Env;
    }
    else if ((int)scope == -1) {
      pFVar11 = Scope::GetFunc(symScope);
      if (pFVar2 != pFVar11) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar10 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar10 = 1;
        bVar3 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeEmitter.cpp"
                           ,0x14de,"(funcInfo == scope->GetFunc())","funcInfo == scope->GetFunc()");
        if (!bVar3) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        puVar10 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar10 = 0;
      }
      scope._4_4_ = Scope::GetLocation(symScope);
    }
    if (symScope == (Scope *)recList._40_8_) break;
    if ((symScope == (Scope *)0x0) || (bVar3 = Scope::GetIsDynamic(symScope), !bVar3)) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar10 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar10 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeEmitter.cpp"
                         ,0x14e8,"(scope && scope->GetIsDynamic())","scope && scope->GetIsDynamic()"
                        );
      if (!bVar3) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar10 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar10 = 0;
    }
    bVar3 = Scope::GetIsObject(symScope);
    if (!bVar3) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar10 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar10 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeEmitter.cpp"
                         ,0x14e9,"(scope->GetIsObject())","scope->GetIsObject()");
      if (!bVar3) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar10 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar10 = 0;
    }
    DynamicLoadRecord::DynamicLoadRecord((DynamicLoadRecord *)&propertyIndex);
    propertyId = Js::ByteCodeWriter::DefineLabel(&this->m_writer);
    if (pid_local == (IdentPtr)0x0) {
      local_f8 = Ident::GetPropertyId((Ident *)funcInfo_local);
    }
    else {
      local_f8 = Symbol::EnsurePosition((Symbol *)pid_local,this);
    }
    uVar7 = FuncInfo::FindOrAddReferencedPropertyId(_envIndex,local_f8);
    SVar4 = Scope::GetScopeType(symScope);
    iVar9 = (int)scope;
    if (SVar4 == ScopeType_With) {
      if ((int)scope == -1) {
        Js::ByteCodeWriter::BrProperty(&this->m_writer,BrOnHasProperty,propertyId,scope._4_4_,uVar7)
        ;
        propertyIndex = 3;
        rec.kind = scope._4_4_;
      }
      else {
        uVar5 = Js::FrameDisplay::GetOffsetOfScopes();
        DVar6 = iVar9 + (uVar5 >> 3);
        Js::ByteCodeWriter::BrEnvProperty(&this->m_writer,BrOnHasEnvProperty,propertyId,uVar7,DVar6)
        ;
        propertyIndex = 4;
        rec.kind = DVar6;
      }
    }
    else if ((int)scope == -1) {
      Js::ByteCodeWriter::BrLocalProperty(&this->m_writer,BrOnHasLocalProperty,propertyId,uVar7);
      propertyIndex = 1;
      rec.kind = scope._4_4_;
    }
    else {
      uVar5 = Js::FrameDisplay::GetOffsetOfScopes();
      DVar6 = iVar9 + (uVar5 >> 3);
      Js::ByteCodeWriter::BrEnvProperty
                (&this->m_writer,BrOnHasLocalEnvProperty,propertyId,uVar7,DVar6);
      propertyIndex = 2;
      rec.kind = DVar6;
    }
    JsUtil::
    List<DynamicLoadRecord,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>::
    Add((List<DynamicLoadRecord,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
         *)local_78,(DynamicLoadRecord *)&propertyIndex);
  }
  if ((pid_local == (IdentPtr)0x0) || (bVar3 = Symbol::GetIsGlobal((Symbol *)pid_local), bVar3)) {
    if (pid_local == (IdentPtr)0x0) {
      local_12c = Ident::GetPropertyId((Ident *)funcInfo_local);
    }
    else {
      local_12c = Symbol::EnsurePosition((Symbol *)pid_local,this);
    }
    RVar8 = sym_local._4_4_;
    if ((this->flags & 0x404) == 0) {
      uVar7 = FuncInfo::FindOrAddReferencedPropertyId(_envIndex,local_12c);
      Js::ByteCodeWriter::Property(&this->m_writer,DeleteRootFld,RVar8,0xfffffffd,uVar7,false);
    }
    else {
      uVar7 = FuncInfo::FindOrAddReferencedPropertyId(_envIndex,local_12c);
      Js::ByteCodeWriter::ScopedProperty
                (&this->m_writer,ScopedDeleteFld,RVar8,uVar7,
                 (bool)(this->forceStrictModeForClassComputedPropertyName & 1));
    }
  }
  else {
    Symbol::EnsureScopeSlot((Symbol *)pid_local,this,_envIndex);
    Js::ByteCodeWriter::Reg1(&this->m_writer,LdFalse,sym_local._4_4_);
  }
  bVar3 = JsUtil::ReadOnlyList<DynamicLoadRecord,_Memory::ArenaAllocator,_DefaultComparer>::Empty
                    ((ReadOnlyList<DynamicLoadRecord,_Memory::ArenaAllocator,_DefaultComparer> *)
                     local_78);
  if (!bVar3) {
    labelID = Js::ByteCodeWriter::DefineLabel(&this->m_writer);
    Js::ByteCodeWriter::Br(&this->m_writer,labelID);
    propertyId_2 = 0;
    while( true ) {
      if (pid_local == (IdentPtr)0x0) {
        local_160 = Ident::GetPropertyId((Ident *)funcInfo_local);
      }
      else {
        local_160 = Symbol::EnsurePosition((Symbol *)pid_local,this);
      }
      uVar7 = FuncInfo::FindOrAddReferencedPropertyId(_envIndex,local_160);
      pTVar12 = JsUtil::
                List<DynamicLoadRecord,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
                ::Item((List<DynamicLoadRecord,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
                        *)local_78,propertyId_2);
      Js::ByteCodeWriter::MarkLabel(&this->m_writer,pTVar12->label);
      pTVar12 = JsUtil::
                List<DynamicLoadRecord,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
                ::Item((List<DynamicLoadRecord,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
                        *)local_78,propertyId_2);
      switch(pTVar12->kind) {
      case Local:
        Js::ByteCodeWriter::ElementU(&this->m_writer,DeleteLocalFld_ReuseLoc,sym_local._4_4_,uVar7);
        break;
      case Env:
        RVar8 = FuncInfo::AcquireTmpRegister(_envIndex);
        pTVar12 = JsUtil::
                  List<DynamicLoadRecord,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
                  ::Item((List<DynamicLoadRecord,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
                          *)local_78,propertyId_2);
        Js::ByteCodeWriter::SlotI1(&this->m_writer,LdEnvObj,RVar8,(pTVar12->field_2).index);
        Js::ByteCodeWriter::Property
                  (&this->m_writer,DeleteFld_ReuseLoc,sym_local._4_4_,RVar8,uVar7,false);
        FuncInfo::ReleaseTmpRegister(_envIndex,RVar8);
        break;
      case LocalWith:
        RVar8 = FuncInfo::AcquireTmpRegister(_envIndex);
        pTVar12 = JsUtil::
                  List<DynamicLoadRecord,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
                  ::Item((List<DynamicLoadRecord,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
                          *)local_78,propertyId_2);
        Js::ByteCodeWriter::Reg2(&this->m_writer,UnwrapWithObj,RVar8,(pTVar12->field_2).instance);
        Js::ByteCodeWriter::Property
                  (&this->m_writer,DeleteFld_ReuseLoc,sym_local._4_4_,RVar8,uVar7,false);
        FuncInfo::ReleaseTmpRegister(_envIndex,RVar8);
        break;
      case EnvWith:
        RVar8 = FuncInfo::AcquireTmpRegister(_envIndex);
        pTVar12 = JsUtil::
                  List<DynamicLoadRecord,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
                  ::Item((List<DynamicLoadRecord,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
                          *)local_78,propertyId_2);
        Js::ByteCodeWriter::SlotI1(&this->m_writer,LdEnvObj,RVar8,(pTVar12->field_2).index);
        Js::ByteCodeWriter::Reg2(&this->m_writer,UnwrapWithObj,RVar8,RVar8);
        Js::ByteCodeWriter::Property
                  (&this->m_writer,DeleteFld_ReuseLoc,sym_local._4_4_,RVar8,uVar7,false);
        FuncInfo::ReleaseTmpRegister(_envIndex,RVar8);
        break;
      default:
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar10 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar10 = 1;
        bVar3 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeEmitter.cpp"
                           ,0x1554,"((0))","(0)");
        if (!bVar3) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        puVar10 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar10 = 0;
      }
      iVar9 = JsUtil::ReadOnlyList<DynamicLoadRecord,_Memory::ArenaAllocator,_DefaultComparer>::
              Count((ReadOnlyList<DynamicLoadRecord,_Memory::ArenaAllocator,_DefaultComparer> *)
                    local_78);
      if (propertyId_2 == iVar9 + -1) break;
      Js::ByteCodeWriter::Br(&this->m_writer,labelID);
      propertyId_2 = propertyId_2 + 1;
    }
    Js::ByteCodeWriter::MarkLabel(&this->m_writer,labelID);
  }
  JsUtil::
  List<DynamicLoadRecord,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>::
  ~List((List<DynamicLoadRecord,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
         *)local_78);
  return;
}

Assistant:

void ByteCodeGenerator::EmitPropDelete(Js::RegSlot lhsLocation, Symbol *sym, IdentPtr pid, FuncInfo *funcInfo)
{
    // If sym belongs to a parent frame, delete it from the closure environment.
    // If it belongs to this func, but there's a non-local reference, get it from the heap-allocated frame.
    // (TODO: optimize this by getting the sym from its normal location if there are no non-local defs.)
    // Otherwise, just return false.

    Js::RegSlot scopeLocation = Js::Constants::NoRegister;
    Js::PropertyId envIndex = -1;
    Scope *scope = nullptr;
    Scope *symScope = sym ? sym->GetScope() : this->globalScope;
    Assert(symScope);

    JsUtil::List<DynamicLoadRecord, ArenaAllocator> recList(this->alloc);

    for (;;)
    {
        scope = this->FindScopeForSym(symScope, scope, &envIndex, funcInfo);
        if (scope == this->globalScope)
        {
            scopeLocation = ByteCodeGenerator::RootObjectRegister;
        }
        else if (envIndex == -1)
        {
            Assert(funcInfo == scope->GetFunc());
            scopeLocation = scope->GetLocation();
        }

        if (scope == symScope)
        {
            break;
        }

        // Found a scope to which the property may have been added.
        Assert(scope && scope->GetIsDynamic());
        AssertOrFailFast(scope->GetIsObject());

        DynamicLoadRecord rec;

        rec.label = this->m_writer.DefineLabel();
        Js::PropertyId propertyId = sym ? sym->EnsurePosition(this) : pid->GetPropertyId();
        Js::PropertyIdIndexType propertyIndex = funcInfo->FindOrAddReferencedPropertyId(propertyId);

        if (scope->GetScopeType() != ScopeType_With)
        {
            if (envIndex == -1)
            {
                this->m_writer.BrLocalProperty(Js::OpCode::BrOnHasLocalProperty, rec.label, propertyIndex);
                rec.kind = DynamicLoadKind::Local;
                rec.instance = scopeLocation;
            }
            else
            {
                uint32 frameDisplayIndex = envIndex + Js::FrameDisplay::GetOffsetOfScopes() / sizeof(Js::Var);
                this->m_writer.BrEnvProperty(Js::OpCode::BrOnHasLocalEnvProperty, rec.label, propertyIndex, frameDisplayIndex);
                rec.kind = DynamicLoadKind::Env;
                rec.index = frameDisplayIndex;
            }
        }
        else
        {
            if (envIndex == -1)
            {
                this->m_writer.BrProperty(Js::OpCode::BrOnHasProperty, rec.label, scopeLocation, propertyIndex);
                rec.kind = DynamicLoadKind::LocalWith;
                rec.instance = scopeLocation;
            }
            else
            {
                uint32 frameDisplayIndex = envIndex + Js::FrameDisplay::GetOffsetOfScopes() / sizeof(Js::Var);
                this->m_writer.BrEnvProperty(Js::OpCode::BrOnHasEnvProperty, rec.label, propertyIndex, frameDisplayIndex);
                rec.kind = DynamicLoadKind::EnvWith;
                rec.index = frameDisplayIndex;
            }
        }

        recList.Add(rec);
    }

    // Arrived at the scope in which the property was defined.
    if (sym == nullptr || sym->GetIsGlobal())
    {
        Js::PropertyId propertyId = sym ? sym->EnsurePosition(this) : pid->GetPropertyId();
        if (this->flags & (fscrEval | fscrImplicitThis))
        {
            this->m_writer.ScopedProperty(Js::OpCode::ScopedDeleteFld, lhsLocation,
                funcInfo->FindOrAddReferencedPropertyId(propertyId), forceStrictModeForClassComputedPropertyName);
        }
        else
        {
            this->m_writer.Property(Js::OpCode::DeleteRootFld, lhsLocation, ByteCodeGenerator::RootObjectRegister,
                funcInfo->FindOrAddReferencedPropertyId(propertyId));
        }
    }
    else
    {
        // The delete will look like a non-local reference, so make sure a slot is reserved.
        sym->EnsureScopeSlot(this, funcInfo);
        this->m_writer.Reg1(Js::OpCode::LdFalse, lhsLocation);
    }

    if (!recList.Empty())
    {
        Js::ByteCodeLabel doneLabel = this->m_writer.DefineLabel();
        this->m_writer.Br(doneLabel);

        for (int i = 0;; i++)
        {
            Js::RegSlot instLocation;
            Js::PropertyId propertyId = sym ? sym->EnsurePosition(this) : pid->GetPropertyId();
            Js::PropertyIdIndexType propertyIndex = funcInfo->FindOrAddReferencedPropertyId(propertyId);

            this->m_writer.MarkLabel(recList.Item(i).label);
            switch(recList.Item(i).kind)
            {
                case DynamicLoadKind::Local:
                    this->m_writer.ElementU(Js::OpCode::DeleteLocalFld_ReuseLoc, lhsLocation, propertyIndex);
                    break;

                case DynamicLoadKind::Env:
                    instLocation = funcInfo->AcquireTmpRegister();
                    this->m_writer.SlotI1(Js::OpCode::LdEnvObj, instLocation, recList.Item(i).index);
                    this->m_writer.Property(Js::OpCode::DeleteFld_ReuseLoc, lhsLocation, instLocation, propertyIndex);
                    funcInfo->ReleaseTmpRegister(instLocation);
                    break;

                case DynamicLoadKind::LocalWith:
                    instLocation = funcInfo->AcquireTmpRegister();
                    this->m_writer.Reg2(Js::OpCode::UnwrapWithObj, instLocation, recList.Item(i).instance);
                    this->m_writer.Property(Js::OpCode::DeleteFld_ReuseLoc, lhsLocation, instLocation, propertyIndex);
                    funcInfo->ReleaseTmpRegister(instLocation);
                    break;

                case DynamicLoadKind::EnvWith:
                    instLocation = funcInfo->AcquireTmpRegister();
                    this->m_writer.SlotI1(Js::OpCode::LdEnvObj, instLocation, recList.Item(i).index);
                    this->m_writer.Reg2(Js::OpCode::UnwrapWithObj, instLocation, instLocation);
                    this->m_writer.Property(Js::OpCode::DeleteFld_ReuseLoc, lhsLocation, instLocation, propertyIndex);
                    funcInfo->ReleaseTmpRegister(instLocation);
                    break;

                default:
                    AssertOrFailFast(UNREACHED);
            }

            if (i == recList.Count() - 1)
            {
                break;
            }
            this->m_writer.Br(doneLabel);
        }

        this->m_writer.MarkLabel(doneLabel);
    }
}